

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManPlaceDfs_rec(Frc_Man_t *p,Frc_Obj_t *pObj,int *piPlace)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = pObj->iFanout;
  if (uVar2 != 0) {
    pObj->iFanout = uVar2 - 1;
    if (uVar2 == pObj->nFanouts) {
      uVar2 = *(uint *)pObj;
      if ((uVar2 & 1) == 0) {
        for (uVar3 = 0; uVar3 < uVar2 >> 4; uVar3 = uVar3 + 1) {
          Frc_ManPlaceDfs_rec(p,(Frc_Obj_t *)
                                ((long)pObj + (long)*(int *)(&pObj[1].field_0x0 + uVar3 * 4) * -4),
                              piPlace);
          uVar2 = *(uint *)pObj;
        }
      }
      iVar1 = *piPlace;
      *piPlace = iVar1 + 1;
      pObj->pPlace = iVar1;
    }
    return;
  }
  __assert_fail("pObj->iFanout > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                ,800,"void Frc_ManPlaceDfs_rec(Frc_Man_t *, Frc_Obj_t *, int *)");
}

Assistant:

void Frc_ManPlaceDfs_rec( Frc_Man_t * p, Frc_Obj_t * pObj, int * piPlace )
{
    assert( pObj->iFanout > 0 );
    if ( pObj->iFanout-- == pObj->nFanouts )
    {
        Frc_Obj_t * pFanin;
        int i;
        if ( !Frc_ObjIsCi(pObj) )
            Frc_ObjForEachFanin( pObj, pFanin, i )
                Frc_ManPlaceDfs_rec( p, pFanin, piPlace );
        pObj->pPlace = (*piPlace)++;
    }
}